

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

string * getBtnsState_abi_cxx11_(void)

{
  ulong uVar1;
  
  if (getBtnsState[abi:cxx11]()::sState_abi_cxx11_ == '\0') {
    getBtnsState_abi_cxx11_();
  }
  __getPinsState((GPIOClass *)&btnPool,2,&getBtnsState[abi:cxx11]()::sState_abi_cxx11_);
  if (getBtnsState[abi:cxx11]()::sState_abi_cxx11_._M_string_length != 0) {
    uVar1 = 0;
    do {
      getBtnsState[abi:cxx11]()::sState_abi_cxx11_._M_dataplus._M_p[uVar1] =
           getBtnsState[abi:cxx11]()::sState_abi_cxx11_._M_dataplus._M_p[uVar1] == '0' | 0x30;
      uVar1 = uVar1 + 1;
    } while (uVar1 < getBtnsState[abi:cxx11]()::sState_abi_cxx11_._M_string_length);
  }
  return &getBtnsState[abi:cxx11]()::sState_abi_cxx11_;
}

Assistant:

const string& getBtnsState()
{
    static string sState;
    __getPinsState(btnPool, BTNS_CNT, sState);
	for(int i = 0;i < sState.length(); i++)
	{
		sState[i] = (sState[i] == '0') ? '1' : '0';
	}
    return sState;
}